

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Config config;
  CMakeParser parser;
  Config local_1e8;
  CMakeParser local_1b8;
  
  ParseOptions(&local_1e8,argc,argv);
  CMakeParser::CMakeParser(&local_1b8);
  CMakeParser::SetDebugMode(&local_1b8,local_1e8.debugMode);
  local_1b8.evalMode = local_1e8.evalMode;
  local_1b8.parserCtx.immediateEval = local_1e8.evalMode == Immediate;
  CMakeParser::SetInput(&local_1b8,local_1e8.inputMode,&local_1e8.input);
  iVar1 = CMakeParser::Parse(&local_1b8);
  CMakeParser::~CMakeParser(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1e8.input);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    const auto config = ParseOptions(argc, argv);
    CMakeParser parser;

    parser.SetDebugMode(config.debugMode);
    parser.SetEvaluationMode(config.evalMode);
    parser.SetInput(config.inputMode, config.input);

    return parser.Parse();
}